

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void template_setfloat(t_template *x,t_symbol *fieldname,t_word *wp,t_float f,int loud)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *fmt;
  int type;
  int onset;
  t_symbol *arraytype;
  int local_30;
  int local_2c;
  t_symbol *local_28;
  
  iVar1 = template_find_field(x,fieldname,&local_2c,&local_30,&local_28);
  if (iVar1 == 0) {
    if (loud != 0) {
      pcVar3 = x->t_sym->s_name;
      pcVar2 = fieldname->s_name;
      fmt = "%s.%s: no such field";
LAB_00158275:
      pd_error((void *)0x0,fmt,pcVar3,pcVar2);
      return;
    }
  }
  else if (local_30 == 0) {
    *(t_float *)((long)wp + (long)local_2c) = f;
  }
  else if (loud != 0) {
    pcVar3 = x->t_sym->s_name;
    pcVar2 = fieldname->s_name;
    fmt = "%s.%s: not a number";
    goto LAB_00158275;
  }
  return;
}

Assistant:

void template_setfloat(t_template *x, t_symbol *fieldname, t_word *wp,
    t_float f, int loud)
{
    int onset, type;
    t_symbol *arraytype;
    if (template_find_field(x, fieldname, &onset, &type, &arraytype))
     {
        if (type == DT_FLOAT)
            *(t_float *)(((char *)wp) + onset) = f;
        else if (loud) pd_error(0, "%s.%s: not a number",
            x->t_sym->s_name, fieldname->s_name);
    }
    else if (loud) pd_error(0, "%s.%s: no such field",
        x->t_sym->s_name, fieldname->s_name);
}